

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXParser.cpp
# Opt level: O2

string * __thiscall
Assimp::FBX::ParseTokenAsString_abi_cxx11_
          (string *__return_storage_ptr__,FBX *this,Token *t,char **err_out)

{
  int iVar1;
  ulong uVar2;
  allocator<char> *__a;
  char *pcVar3;
  char *pcVar4;
  allocator<char> local_c;
  allocator<char> local_b;
  allocator<char> local_a;
  allocator<char> local_9;
  
  t->sbegin = (char *)0x0;
  if (*(int *)(this + 0x10) == 2) {
    if (*(int *)(this + 0x20) == -1) {
      pcVar4 = *(char **)this;
      if (*pcVar4 == 'S') {
        iVar1 = *(int *)(pcVar4 + 1);
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar3 = pcVar4 + (long)iVar1 + 5;
        pcVar4 = pcVar4 + 5;
LAB_00511060:
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)__return_storage_ptr__,pcVar4,pcVar3);
        return __return_storage_ptr__;
      }
      t->sbegin = "failed to parse S(tring), unexpected data type (binary)";
      __a = &local_a;
    }
    else {
      pcVar4 = *(char **)this;
      uVar2 = *(long *)(this + 8) - (long)pcVar4;
      if (uVar2 < 2) {
        t->sbegin = "token is too short to hold a string";
        __a = &local_b;
      }
      else {
        if ((*pcVar4 == '\"') && (*(char *)(*(long *)(this + 8) + -1) == '\"')) {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          pcVar3 = pcVar4 + (uVar2 - 1);
          pcVar4 = pcVar4 + 1;
          goto LAB_00511060;
        }
        t->sbegin = "expected double quoted string";
        __a = &local_c;
      }
    }
  }
  else {
    t->sbegin = "expected TOK_DATA token";
    __a = &local_9;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,"",__a);
  return __return_storage_ptr__;
}

Assistant:

std::string ParseTokenAsString(const Token& t, const char*& err_out)
{
    err_out = NULL;

    if (t.Type() != TokenType_DATA) {
        err_out = "expected TOK_DATA token";
        return "";
    }

    if(t.IsBinary())
    {
        const char* data = t.begin();
        if (data[0] != 'S') {
            err_out = "failed to parse S(tring), unexpected data type (binary)";
            return "";
        }

        // read string length
        BE_NCONST int32_t len = SafeParse<int32_t>(data+1, t.end());
        AI_SWAP4(len);

        ai_assert(t.end() - data == 5 + len);
        return std::string(data + 5, len);
    }

    const size_t length = static_cast<size_t>(t.end() - t.begin());
    if(length < 2) {
        err_out = "token is too short to hold a string";
        return "";
    }

    const char* s = t.begin(), *e = t.end() - 1;
    if (*s != '\"' || *e != '\"') {
        err_out = "expected double quoted string";
        return "";
    }

    return std::string(s+1,length-2);
}